

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Generators::Generators<arg_res_tuple<float,_3UL>_>::populate
          (Generators<arg_res_tuple<float,_3UL>_> *this,arg_res_tuple<float,_3UL> *val)

{
  long lVar1;
  pointer *__ptr;
  GeneratorWrapper<arg_res_tuple<float,_3UL>_> local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_false>.
  _M_head_impl = (unique_ptr<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
                  )operator_new(0x18);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_false>.
   _M_head_impl = &PTR__GeneratorUntypedBase_00318768;
  lVar1 = *(long *)((val->x).super_array<float,_3UL>._M_elems + 2);
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_false>
                  ._M_head_impl + 8) = *(long *)(val->x).super_array<float,_3UL>._M_elems;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_false>
                  ._M_head_impl + 0x10) = lVar1;
  std::
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,3ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,3ul>>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,3ul>>>
            ((vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,3ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,3ul>>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
      .super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_std::default_delete<Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_3UL>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }